

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_float.cpp
# Opt level: O2

float ximu::FixedFloat::toFloat(char msb,char lsb,Qvals q)

{
  return (float)(int)CONCAT11(msb,lsb) / (float)(1 << ((byte)q & 0x1f));
}

Assistant:

float FixedFloat::toFloat(char msb, char lsb, Qvals q) {
  return toFloat(toFixed(msb, lsb), q);
}